

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O3

void __thiscall
NoiseModel_InitFailsWithInvalidBitdepth_Test::TestBody
          (NoiseModel_InitFailsWithInvalidBitdepth_Test *this)

{
  undefined8 *puVar1;
  int iVar2;
  char *in_R9;
  uint uVar3;
  long lVar4;
  aom_noise_model_params_t params;
  aom_noise_model_params_t params_00;
  aom_noise_model_params_t params_01;
  aom_noise_model_t model;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_330;
  internal local_328 [8];
  undefined8 *local_320;
  AssertHelper local_318;
  string local_310;
  aom_noise_model_t local_2f0;
  
  lVar4 = 0;
  do {
    uVar3 = (uint)lVar4;
    if ((uVar3 < 0xd) && ((0x1500U >> (uVar3 & 0x1f) & 1) != 0)) {
      params.bit_depth = (int)lVar4;
      params.use_highbd = (int)((ulong)lVar4 >> 0x20);
      params.shape = '\x01';
      params._1_3_ = 0;
      params.lag = 2;
      iVar2 = aom_noise_model_init(&local_2f0,params);
      local_328[0] = (internal)(iVar2 != 0);
      local_320 = (undefined8 *)0x0;
      if (!(bool)local_328[0]) {
        testing::Message::Message((Message *)&local_330);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_330._M_head_impl + 0x10),"bit_depth: ",0xb);
        std::ostream::operator<<(local_330._M_head_impl + 0x10,uVar3);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_310,local_328,(AssertionResult *)"aom_noise_model_init(&model, params)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_318,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x15a,local_310._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_330);
        testing::internal::AssertHelper::~AssertHelper(&local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
        if (local_330._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_330._M_head_impl + 8))();
        }
        puVar1 = local_320;
        if (local_320 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_320 != local_320 + 2) {
            operator_delete((undefined8 *)*local_320);
          }
          operator_delete(puVar1);
        }
      }
      aom_noise_model_free(&local_2f0);
    }
    else {
      params_00.bit_depth = (int)lVar4;
      params_00.use_highbd = (int)((ulong)lVar4 >> 0x20);
      params_00.shape = '\x01';
      params_00._1_3_ = 0;
      params_00.lag = 2;
      iVar2 = aom_noise_model_init(&local_2f0,params_00);
      local_328[0] = (internal)(iVar2 == 0);
      local_320 = (undefined8 *)0x0;
      if (!(bool)local_328[0]) {
        testing::Message::Message((Message *)&local_330);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_330._M_head_impl + 0x10),"bit_depth: ",0xb);
        std::ostream::operator<<(local_330._M_head_impl + 0x10,uVar3);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_310,local_328,(AssertionResult *)"aom_noise_model_init(&model, params)",
                   "true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_318,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x15d,local_310._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_330);
        testing::internal::AssertHelper::~AssertHelper(&local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
        if (local_330._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_330._M_head_impl + 8))();
        }
        puVar1 = local_320;
        if (local_320 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_320 != local_320 + 2) {
            operator_delete((undefined8 *)*local_320);
          }
          operator_delete(puVar1);
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x21);
  params_01.bit_depth = 0x7fffffff;
  params_01.use_highbd = 0;
  params_01.shape = '\x01';
  params_01._1_3_ = 0;
  params_01.lag = 2;
  iVar2 = aom_noise_model_init(&local_2f0,params_01);
  local_328[0] = (internal)(iVar2 == 0);
  local_320 = (undefined8 *)0x0;
  if (!(bool)local_328[0]) {
    testing::Message::Message((Message *)&local_330);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_310,local_328,(AssertionResult *)"aom_noise_model_init(&model, params)","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x161,local_310._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    if (local_330._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_330._M_head_impl + 8))();
    }
    puVar1 = local_320;
    if (local_320 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_320 != local_320 + 2) {
        operator_delete((undefined8 *)*local_320);
      }
      operator_delete(puVar1);
    }
  }
  return;
}

Assistant:

TEST(NoiseModel, InitFailsWithInvalidBitdepth) {
  aom_noise_model_t model;
  aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 2, 8, 0 };
  for (int i = 0; i <= 32; ++i) {
    params.bit_depth = i;
    if (i == 8 || i == 10 || i == 12) {
      EXPECT_TRUE(aom_noise_model_init(&model, params)) << "bit_depth: " << i;
      aom_noise_model_free(&model);
    } else {
      EXPECT_FALSE(aom_noise_model_init(&model, params)) << "bit_depth: " << i;
    }
  }
  params.bit_depth = INT_MAX;
  EXPECT_FALSE(aom_noise_model_init(&model, params));
}